

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall LINAnalyzerSettings::SetSettingsFromInterfaces(LINAnalyzerSettings *this)

{
  U32 UVar1;
  double dVar2;
  Channel local_20 [16];
  LINAnalyzerSettings *local_10;
  LINAnalyzerSettings *this_local;
  
  local_10 = this;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,local_20);
  Channel::~Channel(local_20);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mLINVersionInterface);
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mLINVersion = dVar2;
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  UVar1 = AnalyzerSettingInterfaceInteger::GetInteger();
  this->mBitRate = UVar1;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return true;
}

Assistant:

bool LINAnalyzerSettings::SetSettingsFromInterfaces()
{
    mInputChannel = mInputChannelInterface->GetChannel();
    mLINVersion = mLINVersionInterface->GetNumber();
    mBitRate = mBitRateInterface->GetInteger();

    ClearChannels();
    AddChannel( mInputChannel, "LIN", true );

    return true;
}